

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwm.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  FILE *__stream;
  int iVar2;
  undefined8 uVar3;
  code *pcVar4;
  char *pcVar5;
  fnSDL12COMPAT_GetWindow pfnSDL12COMPAT_GetWindow;
  SDL_SysWMinfo syswm_info;
  int local_50;
  int h;
  int w;
  int parsed;
  Uint8 *icon_mask;
  SDL_Surface *icon;
  char *title;
  SDL_Event event;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  event.user.data2 = argv;
  argv_local._0_4_ = argc;
  iVar2 = SDL_Init(0x20);
  __stream = _stderr;
  if (iVar2 < 0) {
    uVar3 = SDL_GetError();
    fprintf(__stream,"Couldn\'t initialize SDL: %s\n",uVar3);
    return 1;
  }
  local_50 = 0x280;
  syswm_info.info._52_4_ = 0x1e0;
  video_bpp = '\b';
  video_flags = 0;
  bVar1 = true;
  while (bVar1) {
    if (((int)argv_local < 2) ||
       (iVar2 = strcmp(*(char **)((long)event.user.data2 + 8),"-fullscreen"), iVar2 != 0)) {
      if (((int)argv_local < 2) ||
         (iVar2 = strcmp(*(char **)((long)event.user.data2 + 8),"-resize"), iVar2 != 0)) {
        if (((int)argv_local < 2) ||
           (iVar2 = strcmp(*(char **)((long)event.user.data2 + 8),"-noframe"), iVar2 != 0)) {
          if (((int)argv_local < 3) ||
             (iVar2 = strcmp(*(char **)((long)event.user.data2 + 8),"-width"), iVar2 != 0)) {
            if (((int)argv_local < 3) ||
               (iVar2 = strcmp(*(char **)((long)event.user.data2 + 8),"-height"), iVar2 != 0)) {
              if (((int)argv_local < 3) ||
                 (iVar2 = strcmp(*(char **)((long)event.user.data2 + 8),"-bpp"), iVar2 != 0)) {
                bVar1 = false;
              }
              else {
                iVar2 = atoi(*(char **)((long)event.user.data2 + 0x10));
                video_bpp = (Uint8)iVar2;
                argv_local._0_4_ = (int)argv_local + -2;
                event._16_8_ = event._16_8_ + 0x10;
              }
            }
            else {
              syswm_info.info._52_4_ = atoi(*(char **)((long)event.user.data2 + 0x10));
              argv_local._0_4_ = (int)argv_local + -2;
              event._16_8_ = event._16_8_ + 0x10;
            }
          }
          else {
            local_50 = atoi(*(char **)((long)event.user.data2 + 0x10));
            argv_local._0_4_ = (int)argv_local + -2;
            event._16_8_ = event._16_8_ + 0x10;
          }
        }
        else {
          video_flags = video_flags | 0x20;
          argv_local._0_4_ = (int)argv_local + -1;
          event._16_8_ = event._16_8_ + 8;
        }
      }
      else {
        video_flags = video_flags | 0x10;
        argv_local._0_4_ = (int)argv_local + -1;
        event._16_8_ = event._16_8_ + 8;
      }
    }
    else {
      video_flags = video_flags | 0x80000000;
      argv_local._0_4_ = (int)argv_local + -1;
      event._16_8_ = event._16_8_ + 8;
    }
  }
  icon_mask = (Uint8 *)LoadIconSurface("icon.bmp",(Uint8 **)&w);
  if ((SDL_Surface *)icon_mask != (SDL_Surface *)0x0) {
    SDL_WM_SetIcon(icon_mask,_w);
  }
  if (_w != (Uint8 *)0x0) {
    free(_w);
  }
  if (*(long *)((long)event.user.data2 + 8) == 0) {
    icon = (SDL_Surface *)testtitle;
  }
  else {
    icon = *(SDL_Surface **)((long)event.user.data2 + 8);
  }
  SDL_WM_SetCaption(icon,"testwm");
  SDL_WM_GetCaption(&icon,0);
  if (icon == (SDL_Surface *)0x0) {
    printf("No window title was set!\n");
  }
  else {
    printf("Title was set to: %s\n",icon);
  }
  iVar2 = SetVideoMode(local_50,syswm_info.info._52_4_);
  if (iVar2 < 0) {
    quit(1);
  }
  pfnSDL12COMPAT_GetWindow._0_1_ = 1;
  pfnSDL12COMPAT_GetWindow._1_1_ = 2;
  pfnSDL12COMPAT_GetWindow._2_1_ = 0x45;
  iVar2 = SDL_GetWMInfo(&pfnSDL12COMPAT_GetWindow);
  if (iVar2 == 1) {
    printf("X11 syswm info: display=%p window=%X lock_func=%p unlock_func=%p fswindow=%X wmwindow=%X gfxdisplay=%p\n"
           ,syswm_info._0_8_,(ulong)syswm_info.info.x11.display & 0xffffffff,
           syswm_info.info.x11.window,syswm_info.info.x11.lock_func,
           (ulong)syswm_info.info.x11.unlock_func & 0xffffffff,syswm_info.info.x11.fswindow._0_4_,
           syswm_info.info.x11.wmwindow);
  }
  else {
    uVar3 = SDL_GetError();
    printf("Failed to get syswm info: %s\n",uVar3);
  }
  pcVar4 = (code *)SDL_GL_GetProcAddress("SDL12COMPAT_GetWindow");
  pcVar5 = " (probably using classic SDL 1.2)";
  if (pcVar4 != (code *)0x0) {
    pcVar5 = "";
  }
  printf("SDL12COMPAT_GetWindow address is %p%s\n",pcVar4,pcVar5);
  if (pcVar4 != (code *)0x0) {
    uVar3 = (*pcVar4)();
    printf("SDL 2.0 window: %p\n",uVar3);
  }
  SDL_EventState(0xd,1);
  SDL_SetEventFilter(FilterEvents);
  do {
    while( true ) {
      iVar2 = SDL_WaitEvent(&title);
      if (iVar2 == 0) {
        uVar3 = SDL_GetError();
        printf("SDL_WaitEvent() error: %s\n",uVar3);
        SDL_Quit();
        return 0xff;
      }
      if ((byte)title != 0xc) break;
LAB_001021ff:
      printf("Bye bye..\n");
      quit(0);
LAB_00102214:
      printf("Warning: Event %d wasn\'t filtered\n",(ulong)(byte)title);
    }
    if ((byte)title != 0x10) {
      if ((byte)title == 0x18) {
        printf("Handling internal quit request\n");
        goto LAB_001021ff;
      }
      goto LAB_00102214;
    }
    printf("Got a resize event: %dx%d\n",(ulong)title._4_4_,(ulong)(uint)event.jhat);
    SetVideoMode(title._4_4_,(int)event.jhat);
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
	SDL_Event event;
	char *title;
	SDL_Surface *icon;
	Uint8 *icon_mask;
	int parsed;
	int w, h;

	if ( SDL_Init(SDL_INIT_VIDEO) < 0 ) {
		fprintf(stderr,
			"Couldn't initialize SDL: %s\n", SDL_GetError());
		return(1);
	}

	/* Check command line arguments */
	w = 640;
	h = 480;
	video_bpp = 8;
	video_flags = SDL_SWSURFACE;
	parsed = 1;
	while ( parsed ) {
		if ( (argc >= 2) && (strcmp(argv[1], "-fullscreen") == 0) ) {
			video_flags |= SDL_FULLSCREEN;
			argc -= 1;
			argv += 1;
		} else
		if ( (argc >= 2) && (strcmp(argv[1], "-resize") == 0) ) {
			video_flags |= SDL_RESIZABLE;
			argc -= 1;
			argv += 1;
		} else
		if ( (argc >= 2) && (strcmp(argv[1], "-noframe") == 0) ) {
			video_flags |= SDL_NOFRAME;
			argc -= 1;
			argv += 1;
		} else
		if ( (argc >= 3) && (strcmp(argv[1], "-width") == 0) ) {
			w = atoi(argv[2]);
			argc -= 2;
			argv += 2;
		} else
		if ( (argc >= 3) && (strcmp(argv[1], "-height") == 0) ) {
			h = atoi(argv[2]);
			argc -= 2;
			argv += 2;
		} else
		if ( (argc >= 3) && (strcmp(argv[1], "-bpp") == 0) ) {
			video_bpp = atoi(argv[2]);
			argc -= 2;
			argv += 2;
		} else {
			parsed = 0;
		}
	}

	/* Set the icon -- this must be done before the first mode set */
	icon = LoadIconSurface("icon.bmp", &icon_mask);
	if ( icon != NULL ) {
		SDL_WM_SetIcon(icon, icon_mask);
	}
	if ( icon_mask != NULL )
		free(icon_mask);

	/* Set the title bar */
	if ( argv[1] == NULL )
		title = testtitle;
	else
		title = argv[1];
	SDL_WM_SetCaption(title, "testwm");

	/* See if it's really set */
	SDL_WM_GetCaption(&title, NULL);
	if ( title )
		printf("Title was set to: %s\n", title);
	else
		printf("No window title was set!\n");

	/* Initialize the display */
	if ( SetVideoMode(w, h) < 0 ) {
		quit(1);
	}

#ifdef TEST_SYSWM
	{
		SDL_SysWMinfo syswm_info;
		SDL_VERSION(&syswm_info.version);
		if (SDL_GetWMInfo(&syswm_info) != 1) {
			printf("Failed to get syswm info: %s\n", SDL_GetError());
		} else {
			#ifdef _WIN32
			printf("Windows syswm info: hwnd=%X hglrc=%X\n",
			        (unsigned int) (size_t) syswm_info.window,
			        (unsigned int) (size_t) syswm_info.hglrc);
			#elif defined(SDL_VIDEO_DRIVER_X11)
			printf("X11 syswm info: display=%p window=%X lock_func=%p unlock_func=%p fswindow=%X wmwindow=%X gfxdisplay=%p\n",
			        syswm_info.info.x11.display,
			        (unsigned int) (size_t) syswm_info.info.x11.window,
			        syswm_info.info.x11.lock_func,
			        syswm_info.info.x11.unlock_func,
			        (unsigned int) (size_t) syswm_info.info.x11.fswindow,
			        (unsigned int) (size_t) syswm_info.info.x11.wmwindow,
			        syswm_info.info.x11.gfxdisplay);
			#else
			printf("Generic syswm info: data=%X\n", syswm_info.data);
			#endif
		}
	}

	{
		typedef SDL_Window* (SDLCALL *fnSDL12COMPAT_GetWindow)(void);
		fnSDL12COMPAT_GetWindow pfnSDL12COMPAT_GetWindow = (fnSDL12COMPAT_GetWindow) SDL_GL_GetProcAddress("SDL12COMPAT_GetWindow");
		printf("SDL12COMPAT_GetWindow address is %p%s\n", pfnSDL12COMPAT_GetWindow, pfnSDL12COMPAT_GetWindow ? "" : " (probably using classic SDL 1.2)");
		if (pfnSDL12COMPAT_GetWindow != NULL) {
			printf("SDL 2.0 window: %p\n", pfnSDL12COMPAT_GetWindow());
		}
	}

	SDL_EventState(SDL_SYSWMEVENT, SDL_ENABLE);
#endif

	/* Set an event filter that discards everything but QUIT */
	SDL_SetEventFilter(FilterEvents);

	/* Loop, waiting for QUIT */
	while ( SDL_WaitEvent(&event) ) {
		switch (event.type) {
			case SDL_VIDEORESIZE:
				printf("Got a resize event: %dx%d\n",
				       event.resize.w, event.resize.h);
				SetVideoMode(event.resize.w, event.resize.h);
				break;
			case SDL_USEREVENT:
				printf("Handling internal quit request\n");
				/* Fall through to the quit handler */
			case SDL_QUIT:
				printf("Bye bye..\n");
				quit(0);
			default:
				/* This should never happen */
				printf("Warning: Event %d wasn't filtered\n",
								event.type);
				break;
		}
	}
	printf("SDL_WaitEvent() error: %s\n", SDL_GetError());
	SDL_Quit();
	return(255);
}